

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

int INT_EVdfg_realize(EVdfg dfg)

{
  EVmaster p_Var1;
  EVdfg_configuration p_Var2;
  FILE *__stream;
  __pid_t _Var3;
  int iVar4;
  pthread_t pVar5;
  EVdfg_stone_state p_Var6;
  long lVar7;
  char *__format;
  char *pcVar8;
  int i;
  ulong uVar9;
  timespec local_40;
  
  p_Var1 = dfg->master;
  p_Var2 = dfg->working_state;
  uVar9 = 0;
  do {
    if ((long)p_Var2->stone_count <= (long)uVar9) {
      if (dfg->realized == 1) {
        dfg->master->reconfig = 0;
      }
      dfg->realized = 1;
      return 1;
    }
    iVar4 = CMtrace_val[0xd];
    if (p_Var1->cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(p_Var1->cm,EVdfgVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        __stream = (FILE *)p_Var1->cm->CMTrace_file;
        _Var3 = getpid();
        pVar5 = pthread_self();
        fprintf(__stream,"P%lxT%lx - ",(long)_Var3,pVar5);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf((FILE *)p_Var1->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
      }
      pcVar8 = p_Var2->stones[uVar9]->action;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = "NULL";
      }
      fprintf((FILE *)p_Var1->cm->CMTrace_file,"Stone %d - assigned to node %s, action %s\n",
              uVar9 & 0xffffffff,p_Var1->nodes[p_Var2->stones[uVar9]->node].canonical_name,pcVar8);
    }
    fflush((FILE *)p_Var1->cm->CMTrace_file);
    p_Var6 = p_Var2->stones[uVar9];
    if (p_Var6->node == -1) {
      printf("Warning, stone %d has not been assigned to any node.  This stone will not be deployed.\n"
             ,uVar9 & 0xffffffff);
      puts("    This stones particulars are:");
      fdump_dfg_stone(_stdout,p_Var2->stones[uVar9]);
      p_Var6 = p_Var2->stones[uVar9];
    }
    if (p_Var6->bridge_stone == 0) {
      if (p_Var6->action_count == 0) {
        printf("Warning, stone %d (assigned to node %s) has no actions registered",
               uVar9 & 0xffffffff,p_Var1->nodes[p_Var6->node].canonical_name);
      }
      else {
        iVar4 = max_output_for_action(p_Var6->action,0);
        for (lVar7 = 0; p_Var6 = p_Var2->stones[uVar9], lVar7 < (long)p_Var6->action_count + -1;
            lVar7 = lVar7 + 1) {
          iVar4 = max_output_for_action(p_Var6->extra_actions[lVar7],iVar4);
        }
        if ((p_Var6->out_count == 0) && (0 < iVar4)) {
          pcVar8 = p_Var1->nodes[p_Var6->node].canonical_name;
          __format = 
          "Warning, stone %d (assigned to node %s) has no outputs connected to other stones\n";
        }
        else if ((iVar4 == 1) && (1 < p_Var6->out_count)) {
          pcVar8 = p_Var1->nodes[p_Var6->node].canonical_name;
          __format = 
          "Warning, stone %d (assigned to node %s) has more than one output port linked, but can only support one output\n"
          ;
        }
        else {
          if ((iVar4 != 1) || (*p_Var6->out_links != -1)) goto LAB_001400f7;
          pcVar8 = p_Var1->nodes[p_Var6->node].canonical_name;
          __format = 
          "Warning, stone %d (assigned to node %s) produces at least one output, but output port 0 is unlinked\n"
          ;
        }
        printf(__format,uVar9 & 0xffffffff,pcVar8);
        puts("    This stones particulars are:");
        fdump_dfg_stone(_stdout,p_Var2->stones[uVar9]);
      }
    }
LAB_001400f7:
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

extern int
INT_EVdfg_realize(EVdfg dfg)
{
    check_connectivity(dfg->working_state, dfg->master);
//    check_types(dfg);

    if (dfg->realized == 1) {
	dfg->master->reconfig = 0;
    }
    dfg->realized = 1;
    return 1;
}